

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O2

void fs_write_cb(uv_fs_t *req)

{
  int iVar1;
  uv_work_t *req_00;
  uv_work_t *req_01;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  req_00 = (uv_work_t *)malloc(0x80);
  req_01 = (uv_work_t *)malloc(0x80);
  pool_events_counter = pool_events_counter + 1;
  uv_fs_req_cleanup(req);
  puVar2 = uv_default_loop();
  iVar1 = uv_queue_work(puVar2,req_00,fs_work_cb,fs_after_work_cb);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_queue_work(puVar2,req_01,fs_work_cb,fs_after_work_cb);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      return;
    }
    pcVar4 = "uv_queue_work(uv_default_loop(), work2, fs_work_cb, fs_after_work_cb)";
    uVar3 = 0x123;
  }
  else {
    pcVar4 = "uv_queue_work(uv_default_loop(), work1, fs_work_cb, fs_after_work_cb)";
    uVar3 = 0x11f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
          ,uVar3,pcVar4,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void fs_write_cb(uv_fs_t* req) {
  uv_work_t* work1 = malloc(sizeof(*work1));
  uv_work_t* work2 = malloc(sizeof(*work2));
  pool_events_counter++;

  uv_fs_req_cleanup(req);

  ASSERT_OK(uv_queue_work(uv_default_loop(),
                          work1,
                          fs_work_cb,
                          fs_after_work_cb));
  ASSERT_OK(uv_queue_work(uv_default_loop(),
                          work2,
                          fs_work_cb,
                          fs_after_work_cb));
}